

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::update_rand_timeout(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  uint uVar3;
  ptr<raft_params> params;
  string local_30;
  
  nuraft::context::get_params((context *)&params);
  iVar2 = std::chrono::_V2::system_clock::now();
  uVar3 = (uint)(iVar2 * this->id_) % 0x7fffffff;
  local_30._M_string_length = (size_type)(uVar3 + (uVar3 == 0));
  local_30._M_dataplus._M_p =
       (pointer)CONCAT44((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->election_timeout_upper_bound_,
                         (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->election_timeout_lower_bound_);
  std::function<int()>::operator=
            ((function<int()> *)&this->rand_timeout_,
             (_Bind<std::uniform_int_distribution<int>_(std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>)>
              *)&local_30);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_30,"new timeout range: %d -- %d",
                 (ulong)(uint)(params.
                               super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->election_timeout_lower_bound_,
                 (ulong)(uint)(params.
                               super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->election_timeout_upper_bound_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"update_rand_timeout",0x158,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::update_rand_timeout() {
    ptr<raft_params> params = ctx_->get_params();
    uint seed = (uint)( std::chrono::system_clock::now()
                           .time_since_epoch().count() * id_ );
    std::default_random_engine engine(seed);
    std::uniform_int_distribution<int32>
        distribution( params->election_timeout_lower_bound_,
                      params->election_timeout_upper_bound_ );
    rand_timeout_ = std::bind(distribution, engine);
    p_in("new timeout range: %d -- %d",
         params->election_timeout_lower_bound_,
         params->election_timeout_upper_bound_);
}